

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

string * __thiscall
tinyusdz::tydra::(anonymous_namespace)::DumpXformNodeRec_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,XformNode *node,
          uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _anonymous_namespace_ *p_Var2;
  ostream *poVar3;
  string *psVar4;
  uint32_t n;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar5;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t extraout_EDX_05;
  uint32_t extraout_EDX_06;
  uint32_t extraout_EDX_07;
  uint32_t extraout_EDX_08;
  uint uVar6;
  XformNode *child;
  _anonymous_namespace_ *this_00;
  stringstream ss;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_1e0,(pprint *)((ulong)node & 0xffffffff),n);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Prim name: ",0xb);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)this,*(long *)(this + 8));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," PrimID: ",9);
  poVar3 = ::std::ostream::_M_insert<long>((long)poVar3);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," (Path ",7);
  poVar3 = ::std::operator<<(poVar3,(Path *)(this + 0x20));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,") Xformable? ",0xd);
  poVar3 = ::std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," resetXformStack? ",0x12);
  poVar3 = ::std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," {\n",3);
  paVar1 = &local_1e0.field_2;
  uVar5 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    uVar5 = extraout_EDX_00;
  }
  uVar6 = (int)node + 1;
  pprint::Indent_abi_cxx11_(&local_1e0,(pprint *)(ulong)uVar6,uVar5);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"parent_world: ",0xe);
  poVar3 = ::std::operator<<(poVar3,(matrix4d *)(this + 0x228));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  uVar5 = extraout_EDX_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    uVar5 = extraout_EDX_02;
  }
  pprint::Indent_abi_cxx11_(&local_1e0,(pprint *)(ulong)uVar6,uVar5);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"world: ",7);
  poVar3 = ::std::operator<<(poVar3,(matrix4d *)(this + 0x1a8));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  uVar5 = extraout_EDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    uVar5 = extraout_EDX_04;
  }
  pprint::Indent_abi_cxx11_(&local_1e0,(pprint *)(ulong)uVar6,uVar5);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"local: ",7);
  poVar3 = ::std::operator<<(poVar3,(matrix4d *)(this + 0x128));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  uVar5 = extraout_EDX_05;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    uVar5 = extraout_EDX_06;
  }
  this_00 = *(_anonymous_namespace_ **)(this + 0x108);
  p_Var2 = *(_anonymous_namespace_ **)(this + 0x110);
  if (this_00 != p_Var2) {
    do {
      DumpXformNodeRec_abi_cxx11_(&local_1e0,this_00,(XformNode *)(ulong)uVar6,indent);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      uVar5 = extraout_EDX_07;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        uVar5 = extraout_EDX_08;
      }
      this_00 = this_00 + 0x2a8;
    } while (this_00 != p_Var2);
  }
  pprint::Indent_abi_cxx11_(&local_1e0,(pprint *)(ulong)uVar6,uVar5);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  psVar4 = (string *)::std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string DumpXformNodeRec(const XformNode &node, uint32_t indent) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << "Prim name: " << node.element_name
     << " PrimID: " << node.prim_id << " (Path " << node.absolute_path
     << ") Xformable? " << node.has_xform() << " resetXformStack? "
     << node.has_resetXformStack() << " {\n";
  ss << pprint::Indent(indent + 1)
     << "parent_world: " << node.get_parent_world_matrix() << "\n";
  ss << pprint::Indent(indent + 1) << "world: " << node.get_world_matrix()
     << "\n";
  ss << pprint::Indent(indent + 1) << "local: " << node.get_local_matrix()
     << "\n";

  for (const auto &child : node.children) {
    ss << DumpXformNodeRec(child, indent + 1);
  }
  ss << pprint::Indent(indent + 1) << "}\n";

  return ss.str();
}